

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall
t_go_generator::generate_deserialize_list_element
          (t_go_generator *this,ostream *out,t_list *tlist,bool declare,string *prefix)

{
  t_type *type;
  ostream *poVar1;
  undefined7 in_register_00000009;
  string elem;
  string local_140;
  string local_120;
  string local_100;
  t_field felem;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"_elem","",CONCAT71(in_register_00000009,declare));
  t_generator::tmp(&elem,&this->super_t_generator,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  type = tlist->elem_type_;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,elem._M_dataplus._M_p,
             elem._M_dataplus._M_p + elem._M_string_length);
  t_field::t_field(&felem,type,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  felem.req_ = T_OPT_IN_REQ_OUT;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
  generate_deserialize_field(this,out,&felem,true,&local_140,false,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  poVar1 = t_generator::indent(&this->super_t_generator,out);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = append(",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,elem._M_dataplus._M_p,elem._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_field::~t_field(&felem);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)elem._M_dataplus._M_p != &elem.field_2) {
    operator_delete(elem._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_go_generator::generate_deserialize_list_element(ostream& out,
                                                       t_list* tlist,
                                                       bool declare,
                                                       string prefix) {
  (void)declare;
  string elem = tmp("_elem");
  t_field felem(((t_list*)tlist)->get_elem_type(), elem);
  felem.set_req(t_field::T_OPT_IN_REQ_OUT);
  generate_deserialize_field(out, &felem, true, "", false, false, false, true);
  indent(out) << prefix << " = append(" << prefix << ", " << elem << ")" << endl;
}